

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::visitAtomicRMW(I64ToI32Lowering *this,AtomicRMW *curr)

{
  Builder *pBVar1;
  Builder *this_00;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  Index IVar5;
  Call *value;
  Call *value_00;
  LocalSet *pLVar6;
  LocalSet *pLVar7;
  Block *e;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  Name target_00;
  undefined1 local_e0 [8];
  TempVar lowBits;
  TempVar highBits;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_80;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_68;
  Expression *local_50;
  Expression *local_48;
  LocalGet *local_40;
  allocator_type local_31;
  
  bVar4 = handleUnreachable(this,(Expression *)curr);
  if ((!bVar4) &&
     ((curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id == 3)) {
    getTemp((TempVar *)local_e0,this,(Type)0x2);
    getTemp((TempVar *)&lowBits.ty,this,(Type)0x2);
    pcVar3 = DAT_00e646b0;
    sVar2 = ABI::wasm2js::ATOMIC_RMW_I64;
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    local_68._M_impl.super__Vector_impl_data._M_start =
         (pointer)Builder::makeConst<int>(pBVar1,curr->op);
    local_68._M_impl.super__Vector_impl_data._M_finish =
         (pointer)Builder::makeConst<int>
                            ((this->builder)._M_t.
                             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                             .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                             (uint)curr->bytes);
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)Builder::makeConst<int>
                            ((this->builder)._M_t.
                             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                             .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                             (int)(curr->offset).addr);
    local_50 = curr->ptr;
    local_48 = curr->value;
    this_00 = (this->builder)._M_t.
              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
              super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    fetchOutParam((TempVar *)&highBits.ty,this,local_48);
    IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
    local_40 = Builder::makeLocalGet(this_00,IVar5,(Type)0x2);
    __l._M_len = 6;
    __l._M_array = (iterator)&local_68;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_80,__l,
               &local_31);
    target.super_IString.str._M_str = pcVar3;
    target.super_IString.str._M_len = sVar2;
    value = Builder::makeCall(pBVar1,target,
                              (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                              &local_80,(Type)0x2,false);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              (&local_80);
    TempVar::~TempVar((TempVar *)&highBits.ty);
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    target_00.super_IString.str._M_str = DAT_00e646c0;
    target_00.super_IString.str._M_len = ABI::wasm2js::GET_STASHED_BITS;
    value_00 = Builder::makeCall((this->builder)._M_t.
                                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                 .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                                 target_00,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 &local_68,(Type)0x2,false);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              (&local_68);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_e0);
    pLVar6 = Builder::makeLocalSet(pBVar1,IVar5,(Expression *)value);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)&lowBits.ty);
    pLVar7 = Builder::makeLocalSet(pBVar1,IVar5,(Expression *)value_00);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_e0);
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)Builder::makeLocalGet(pBVar1,IVar5,(Type)0x2);
    highBits.ty.id = (uintptr_t)&local_68;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)pLVar6;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)pLVar7;
    e = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                  ((this->builder)._M_t.
                   super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                   super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                   (initializer_list<wasm::Expression_*> *)&highBits.ty);
    setOutParam(this,(Expression *)e,(TempVar *)&lowBits.ty);
    Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
               (Expression *)e);
    TempVar::~TempVar((TempVar *)&lowBits.ty);
    TempVar::~TempVar((TempVar *)local_e0);
  }
  return;
}

Assistant:

void visitAtomicRMW(AtomicRMW* curr) {
    if (handleUnreachable(curr)) {
      return;
    }
    if (curr->type != Type::i64) {
      return;
    }
    // We cannot break this up into smaller operations as it must be atomic.
    // Lower to an instrinsic function that wasm2js will implement.
    TempVar lowBits = getTemp();
    TempVar highBits = getTemp();
    auto* getLow = builder->makeCall(
      ABI::wasm2js::ATOMIC_RMW_I64,
      {builder->makeConst(int32_t(curr->op)),
       builder->makeConst(int32_t(curr->bytes)),
       builder->makeConst(int32_t(curr->offset)),
       curr->ptr,
       curr->value,
       builder->makeLocalGet(fetchOutParam(curr->value), Type::i32)},
      Type::i32);
    auto* getHigh =
      builder->makeCall(ABI::wasm2js::GET_STASHED_BITS, {}, Type::i32);
    auto* setLow = builder->makeLocalSet(lowBits, getLow);
    auto* setHigh = builder->makeLocalSet(highBits, getHigh);
    auto* finalGet = builder->makeLocalGet(lowBits, Type::i32);
    auto* result = builder->makeBlock({setLow, setHigh, finalGet});
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }